

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

UCVarValue FBaseCVar::FromString(char *value,ECVarType type)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  UCVarValue ret;
  
  switch(type) {
  case CVAR_Bool:
    iVar2 = strcasecmp(value,"true");
    if (iVar2 == 0) {
      ret.Bool = true;
    }
    else {
      iVar2 = strcasecmp(value,"false");
      if (iVar2 == 0) {
        ret.String = (char *)((ulong)(uint7)ret._1_7_ << 8);
      }
      else {
        lVar3 = strtol(value,(char **)0x0,0);
        ret.Bool = lVar3 != 0;
      }
    }
    break;
  case CVAR_Int:
    iVar2 = strcasecmp(value,"true");
    if (iVar2 == 0) {
      ret.Int = 1;
    }
    else {
      iVar2 = strcasecmp(value,"false");
      if (iVar2 == 0) {
        ret.String = (char *)((ulong)(uint)ret._4_4_ << 0x20);
      }
      else {
        lVar3 = strtol(value,(char **)0x0,0);
        ret.Int = (int)lVar3;
      }
    }
    break;
  case CVAR_Float:
    dVar6 = strtod(value,(char **)0x0);
    ret.Float = (float)dVar6;
    break;
  case CVAR_String:
    ret.String = value;
    break;
  case CVAR_GUID:
    ret.String = (char *)0x0;
    if (value != (char *)0x0) {
      uVar5 = 0;
      do {
        pcVar1 = value + uVar5;
        uVar4 = uVar5 + 1;
        if (0x25 < uVar5) break;
        uVar5 = uVar4;
      } while (*pcVar1 != '\0');
      if (*pcVar1 == '\0' && uVar4 == 0x27) {
        uVar5 = strtoul(value + 1,(char **)0x0,0x10);
        cGUID.Data1 = (DWORD)uVar5;
        uVar5 = strtoul(value + 10,(char **)0x0,0x10);
        cGUID.Data2 = (WORD)uVar5;
        uVar5 = strtoul(value + 0xf,(char **)0x0,0x10);
        cGUID.Data3 = (WORD)uVar5;
        cGUID.Data4[0] = HexToByte(value + 0x14);
        cGUID.Data4[1] = HexToByte(value + 0x16);
        cGUID.Data4[2] = HexToByte(value + 0x19);
        cGUID.Data4[3] = HexToByte(value + 0x1b);
        cGUID.Data4[4] = HexToByte(value + 0x1d);
        cGUID.Data4[5] = HexToByte(value + 0x1f);
        cGUID.Data4[6] = HexToByte(value + 0x21);
        cGUID.Data4[7] = HexToByte(value + 0x23);
        ret.String = (char *)&cGUID;
      }
    }
  }
  return (UCVarValue)ret.String;
}

Assistant:

UCVarValue FBaseCVar::FromString (const char *value, ECVarType type)
{
	UCVarValue ret;
	int i;

	switch (type)
	{
	case CVAR_Bool:
		if (stricmp (value, "true") == 0)
			ret.Bool = true;
		else if (stricmp (value, "false") == 0)
			ret.Bool = false;
		else
			ret.Bool = strtol (value, NULL, 0) != 0;
		break;

	case CVAR_Int:
		if (stricmp (value, "true") == 0)
			ret.Int = 1;
		else if (stricmp (value, "false") == 0)
			ret.Int = 0;
		else
			ret.Int = strtol (value, NULL, 0);
		break;

	case CVAR_Float:
		ret.Float = (float)strtod (value, NULL);
		break;

	case CVAR_String:
		ret.String = const_cast<char *>(value);
		break;

	case CVAR_GUID:
		// {xxxxxxxx-xxxx-xxxx-xxxx-xxxxxxxxxxxx}
		// 01234567890123456789012345678901234567
		// 0         1         2         3

		ret.pGUID = NULL;
		if (value == NULL)
		{
			break;
		}
		for (i = 0; value[i] != 0 && i < 38; i++)
		{
			switch (i)
			{
			case 0:
				if (value[i] != '{')
					break;
			case 9:
			case 14:
			case 19:
			case 24:
				if (value[i] != '-')
					break;
			case 37:
				if (value[i] != '}')
					break;
			default:
				if (value[i] < '0' || 
					(value[i] > '9' && value[i] < 'A') || 
					(value[i] > 'F' && value[i] < 'a') || 
					value[i] > 'f')
					break;
			}
		}
		if (i == 38 && value[i] == 0)
		{
			cGUID.Data1 = strtoul (value + 1, NULL, 16);
			cGUID.Data2 = (WORD)strtoul (value + 10, NULL, 16);
			cGUID.Data3 = (WORD)strtoul (value + 15, NULL, 16);
			cGUID.Data4[0] = HexToByte (value + 20);
			cGUID.Data4[1] = HexToByte (value + 22);
			cGUID.Data4[2] = HexToByte (value + 25);
			cGUID.Data4[3] = HexToByte (value + 27);
			cGUID.Data4[4] = HexToByte (value + 29);
			cGUID.Data4[5] = HexToByte (value + 31);
			cGUID.Data4[6] = HexToByte (value + 33);
			cGUID.Data4[7] = HexToByte (value + 35);
			ret.pGUID = &cGUID;
		}
		break;

	default:
		break;
	}

	return ret;
}